

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

int get_entry_symlink(archive_write *a,archive_entry *entry,char **name,size_t *length,
                     archive_string_conv *sc)

{
  wchar_t wVar1;
  int *piVar2;
  archive_entry *in_RCX;
  archive *in_RDI;
  char **in_R8;
  int r;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int local_4;
  
  wVar1 = _archive_entry_symlink_l
                    (in_RCX,in_R8,
                     (size_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (archive_string_conv *)0x18a166);
  if (wVar1 == L'\0') {
    local_4 = 0;
  }
  else {
    piVar2 = __errno_location();
    if (*piVar2 == 0xc) {
      archive_set_error(in_RDI,0xc,"Can\'t allocate memory for Linkname");
      local_4 = -0x1e;
    }
    else {
      local_4 = -0x14;
    }
  }
  return local_4;
}

Assistant:

static int
get_entry_symlink(struct archive_write *a, struct archive_entry *entry,
    const char **name, size_t *length, struct archive_string_conv *sc)
{
	int r;

	r = archive_entry_symlink_l(entry, name, length, sc);
	if (r != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Linkname");
			return (ARCHIVE_FATAL);
		}
		return (ARCHIVE_WARN);
	}
	return (ARCHIVE_OK);
}